

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddMacro(cmMakefile *this,char *name)

{
  allocator local_39;
  value_type local_38;
  char *local_18;
  char *name_local;
  cmMakefile *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  if (name != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,name,&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MacrosList,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0xe98,"void cmMakefile::AddMacro(const char *)");
}

Assistant:

void cmMakefile::AddMacro(const char* name)
{
  assert(name);
  this->MacrosList.push_back(name);
}